

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,google::protobuf::EnumValueDescriptor_const*>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,google::protobuf::EnumValueDescriptor_const*>>>
::emplace_at<std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<>>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,google::protobuf::EnumValueDescriptor_const*>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,google::protobuf::EnumValueDescriptor_const*>>>
           *this,iterator iter,piecewise_construct_t *args,tuple<const_int_&> *args_1,
          tuple<> *args_2)

{
  iterator i;
  bool bVar1;
  slot_type *slot;
  pair<const_int,_const_google::protobuf::EnumValueDescriptor_*> *ts;
  const_iterator local_60;
  FindElement local_50;
  iterator local_48;
  tuple<> *local_38;
  tuple<> *args_local_2;
  tuple<const_int_&> *args_local_1;
  piecewise_construct_t *args_local;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
  *this_local;
  iterator iter_local;
  
  iter_local.ctrl_ = (ctrl_t *)iter.field_1;
  this_local = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                *)iter.ctrl_;
  local_38 = args_2;
  args_local_2 = (tuple<> *)args_1;
  args_local_1 = (tuple<const_int_&> *)args;
  args_local = (piecewise_construct_t *)this;
  slot = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
         ::iterator::slot((iterator *)&this_local);
  construct<std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<>>
            (this,slot,(piecewise_construct_t *)args_local_1,(tuple<const_int_&> *)args_local_2,
             local_38);
  local_50.s = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                *)this;
  ts = (pair<const_int,_const_google::protobuf::EnumValueDescriptor_*> *)
       raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
       ::iterator::operator*((iterator *)&this_local);
  local_48 = (iterator)
             hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,google::protobuf::EnumValueDescriptor_const*>,void>
             ::
             apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,google::protobuf::EnumValueDescriptor_const*>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,google::protobuf::EnumValueDescriptor_const*>>>::FindElement,std::pair<int_const,google::protobuf::EnumValueDescriptor_const*>&,absl::lts_20250127::container_internal::FlatHashMapPolicy<int,google::protobuf::EnumValueDescriptor_const*>>
                       (&local_50,ts);
  i.field_1.slot_ = (slot_type *)iter_local.ctrl_;
  i.ctrl_ = (ctrl_t *)this_local;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
  ::const_iterator::const_iterator(&local_60,i);
  bVar1 = container_internal::operator==((const_iterator *)&local_48,&local_60);
  if (!bVar1) {
    __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xfe2,
                  "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, const google::protobuf::EnumValueDescriptor *>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, const google::protobuf::EnumValueDescriptor *>>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashMapPolicy<int, const google::protobuf::EnumValueDescriptor *>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, const google::protobuf::EnumValueDescriptor *>>, Args = <const std::piecewise_construct_t &, std::tuple<const int &>, std::tuple<>>]"
                 );
  }
  return;
}

Assistant:

void emplace_at(iterator iter, Args&&... args) {
    construct(iter.slot(), std::forward<Args>(args)...);

    assert(PolicyTraits::apply(FindElement{*this}, *iter) == iter &&
           "constructed value does not match the lookup key");
  }